

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O0

ssize_t __thiscall Pl_AES_PDF::write(Pl_AES_PDF *this,int __fd,void *__buf,size_t __n)

{
  uchar *__src;
  undefined4 in_register_00000034;
  uchar *local_50;
  size_t bytes;
  size_t available;
  uchar *p;
  size_t bytes_left;
  size_t len_local;
  uchar *data_local;
  Pl_AES_PDF *this_local;
  
  __src = (uchar *)CONCAT44(in_register_00000034,__fd);
  p = (uchar *)__buf;
  while (p != (uchar *)0x0) {
    if (this->offset == 0x10) {
      flush(this,false);
    }
    local_50 = (uchar *)(0x10 - this->offset);
    if (p < local_50) {
      local_50 = p;
    }
    p = p + -(long)local_50;
    memcpy(this->inbuf + this->offset,__src,(size_t)local_50);
    this->offset = (size_t)(local_50 + this->offset);
    __src = local_50 + (long)__src;
  }
  return (ssize_t)__src;
}

Assistant:

void
Pl_AES_PDF::write(unsigned char const* data, size_t len)
{
    size_t bytes_left = len;
    unsigned char const* p = data;

    while (bytes_left > 0) {
        if (this->offset == this->buf_size) {
            flush(false);
        }

        size_t available = this->buf_size - this->offset;
        size_t bytes = (bytes_left < available ? bytes_left : available);
        bytes_left -= bytes;
        std::memcpy(this->inbuf + this->offset, p, bytes);
        this->offset += bytes;
        p += bytes;
    }
}